

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O3

void linfdelnum(lindef *lin,objnum objn)

{
  long lVar1;
  long lVar2;
  ushort *puVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  objnum *poVar7;
  uchar *puVar8;
  uchar *__src;
  ulong uVar9;
  undefined1 *puVar10;
  objnum *__dest;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  _func_void_lindef_ptr_objnum_objnum **pp_Var17;
  uint uVar18;
  ulong uVar19;
  size_t __n;
  ulong uVar20;
  
  uVar6 = *(uint *)&lin[2].linbuf;
  if ((uVar6 != 0) && (uVar5 = ((int)(uVar6 - 1) >> 10) + 1, uVar5 != 0)) {
    pp_Var17 = &lin[1].linrenp;
    uVar20 = (ulong)uVar5;
    puVar10 = (undefined1 *)((long)&lin[1].linrenp + 4);
    do {
      poVar7 = (objnum *)mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)pp_Var17);
      if (0 < (int)uVar6) {
        uVar5 = 0x400;
        if (uVar6 < 0x400) {
          uVar5 = uVar6;
        }
        iVar11 = 0;
        iVar12 = 0;
        lVar15 = 0;
        __dest = poVar7;
        do {
          lVar1 = lVar15 + 1;
          if (*__dest == objn) {
            uVar14 = 1;
            if (lVar1 < (int)uVar5) {
              uVar14 = (ulong)(iVar12 + uVar5);
              uVar9 = 4;
              uVar19 = 1;
              do {
                if (*(objnum *)((long)__dest + uVar9) != objn) {
                  memmove(__dest,(void *)((uVar9 & 0xffffffff) + (long)__dest),
                          (long)(int)((iVar11 + uVar5 * 4) - (int)uVar9));
                  uVar14 = uVar19 & 0xffffffff;
                  break;
                }
                uVar9 = uVar9 + 4;
                lVar2 = lVar15 + uVar19;
                uVar19 = uVar19 + 1;
              } while (lVar2 + 1 < (long)(int)uVar5);
            }
            iVar13 = (int)uVar14;
            if (uVar20 == 1) {
              uVar5 = uVar5 - iVar13;
            }
            else {
              puVar8 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)pp_Var17 + 2));
              uVar9 = (ulong)(uint)(iVar13 * 4);
              memcpy((void *)((long)(int)((uVar5 - iVar13) * 4) + (long)poVar7),puVar8,uVar9);
              mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)pp_Var17 + 2));
              if (1 < uVar20) {
                lVar15 = 0;
                uVar16 = uVar6;
                do {
                  uVar18 = 0x400;
                  if ((int)uVar16 < 0x400) {
                    uVar18 = uVar16;
                  }
                  puVar8 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(puVar10 + lVar15 * 2 + -2));
                  __n = (size_t)(int)((uVar18 - iVar13) * 4);
                  memmove(puVar8,puVar8 + uVar9,__n);
                  if (lVar15 + 2U < uVar20) {
                    __src = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(puVar10 + lVar15 * 2));
                    memcpy(puVar8 + __n,__src,uVar9);
                    mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(puVar10 + lVar15 * 2));
                  }
                  uVar4 = *(ushort *)
                           (*(long *)(lin[1].linofsp +
                                     (ulong)(*(ushort *)(puVar10 + lVar15 * 2 + -2) >> 8) * 8 + 0x30
                                     ) + (ulong)(*(ushort *)(puVar10 + lVar15 * 2 + -2) & 0xff) * 2)
                  ;
                  puVar3 = (ushort *)
                           (*(long *)(**(long **)lin[1].linofsp + (ulong)(uVar4 >> 8) * 8) + 0x14 +
                           (ulong)((uVar4 & 0xff) << 5));
                  *puVar3 = *puVar3 | 1;
                  mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)(puVar10 + lVar15 * 2 + -2));
                  uVar16 = uVar16 - 0x400;
                  lVar15 = lVar15 + 1;
                } while (uVar20 - 1 != lVar15);
              }
            }
            lin[2].linbuf = lin[2].linbuf + -uVar14;
          }
          __dest = __dest + 2;
          iVar12 = iVar12 + -1;
          iVar11 = iVar11 + -4;
          lVar15 = lVar1;
        } while (lVar1 < (int)uVar5);
      }
      uVar4 = *(ushort *)
               (*(long *)(lin[1].linofsp + (ulong)(*(ushort *)pp_Var17 >> 8) * 8 + 0x30) +
               (ulong)(*(ushort *)pp_Var17 & 0xff) * 2);
      puVar3 = (ushort *)
               (*(long *)(**(long **)lin[1].linofsp + (ulong)(uVar4 >> 8) * 8) + 0x14 +
               (ulong)((uVar4 & 0xff) << 5));
      *puVar3 = *puVar3 | 1;
      mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)pp_Var17);
      pp_Var17 = (_func_void_lindef_ptr_objnum_objnum **)((long)pp_Var17 + 2);
      uVar20 = uVar20 - 1;
      uVar6 = uVar6 - 0x400;
      puVar10 = puVar10 + 2;
    } while ((int)uVar20 != 0);
  }
  return;
}

Assistant:

void linfdelnum(lindef *lin, objnum objn)
{
#   define  linf ((linfdef *)lin)
    uint    pgcnt;
    uchar  *objp;
    uchar  *objp_orig;
    mcmon  *pgobjn;
    int     i;
    int     pgtot;
    int     tot;

    /* figure the number of pages - if no lines, stop now */
    tot = linf->linfcrec;
    if (tot == 0)
        return;

    /* calculate the number of pages to check */
    pgcnt = 1 + ((tot - 1) >> 10);

    /* scan each page */
    for (pgobjn = linf->linfpg ; pgcnt ; ++pgobjn, --pgcnt, tot -= 1024)
    {
        /* lock the page */
        objp = objp_orig = mcmlck(linf->linfmem, *pgobjn);

        /* figure the number on this page */
        pgtot = (tot > 1024 ? 1024 : tot);

        /* scan each record on this page */
        for (i = 0 ; i < pgtot ; ++i, objp += DBGLINFSIZ)
        {
            int j;
            
            /* check this one */
            if (osrp2(objp) == objn)
            {
                uchar *nxtp;
                uint pg;
                int delcnt;
                int totrem;
                
                /* 
                 *   it matches - delete it, along with any subsequent
                 *   contiguous entries that also match it 
                 */
                for (delcnt = 1, j = i + 1 ; j < pgtot ; ++j, ++delcnt)
                {
                    /* 
                     *   if this one doesn't match, we've found the end of
                     *   the contiguous records for this object 
                     */
                    if (osrp2(objp + (j - i)*DBGLINFSIZ) != objn)
                        break;
                }

                /* close up the gap on this page */
                if (j < pgtot)
                    memmove(objp, objp + delcnt*DBGLINFSIZ,
                            (pgtot - j)*DBGLINFSIZ);

                /* 
                 *   if this isn't the last page, copy the bottom of the
                 *   next page to the gap at the top of this page 
                 */
                if (pgcnt > 1)
                {
                    /* lock the next page */
                    nxtp = mcmlck(linf->linfmem, *(pgobjn + 1));

                    /* 
                     *   copy from the beginning of the next page to the
                     *   end of this page 
                     */
                    memcpy(objp_orig + (pgtot - delcnt)*DBGLINFSIZ,
                           nxtp, delcnt*DBGLINFSIZ);

                    /* done with the page */
                    mcmunlck(linf->linfmem, *(pgobjn + 1));
                }
                else
                {
                    /* 
                     *   this is the last page, so there's no next page to
                     *   copy items from - reduce the count of items on
                     *   this page accordingly 
                     */
                    pgtot -= delcnt;
                }

                /*
                 *   Now rearrange all subsequent pages to accommodate the
                 *   gap we just created 
                 */
                for (totrem = tot, pg = 1 ; pg < pgcnt ;
                     totrem -= 1024, ++pg)
                {
                    uchar *curp;
                    int curtot;

                    /* figure how many we have on this page */
                    curtot = (totrem > 1024 ? 1024 : totrem);
                    
                    /* lock this page */
                    curp = mcmlck(linf->linfmem, *(pgobjn + pg));

                    /* delete from the start of this page */
                    memmove(curp, curp + delcnt*DBGLINFSIZ,
                            (curtot - delcnt)*DBGLINFSIZ);

                    /* if there's another page, copy from it */
                    if (pg + 1 < pgcnt)
                    {
                        /* lock the next page */
                        nxtp = mcmlck(linf->linfmem, *(pgobjn + pg + 1));

                        /* 
                         *   copy from the start of the next page to the
                         *   end of this page 
                         */
                        memcpy(curp + (curtot - delcnt)*DBGLINFSIZ,
                               nxtp, delcnt*DBGLINFSIZ);

                        /* unlock it */
                        mcmunlck(linf->linfmem, *(pgobjn + pg + 1));
                    }

                    /* done with the page - touch it and unlock it */
                    mcmtch(linf->linfmem, *(pgobjn + pg));
                    mcmunlck(linf->linfmem, *(pgobjn + pg));
                }

                /* deduct the removed records from the total */
                linf->linfcrec -= delcnt;
            }
        }

        /* done with the page - touch it and unlock it */
        mcmtch(linf->linfmem, *pgobjn);
        mcmunlck(linf->linfmem, *pgobjn);
    }

#   undef  linf
}